

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

SiameseResult __thiscall siamese::Encoder::Get(Encoder *this,SiameseOriginalPacket *originalOut)

{
  uint uVar1;
  reference original_00;
  SiameseOriginalPacket *in_RSI;
  array<siamese::OriginalPacket,_64UL> *in_RDI;
  OriginalPacket *original;
  uint element;
  size_type in_stack_ffffffffffffff88;
  SiameseResult local_48;
  
  if (((ulong)in_RDI[1]._M_elems[3].Buffer.Data & 1) == 0) {
    if ((in_RSI->PacketNum - *(int *)&in_RDI->_M_elems[0x17].Buffer.Data & 0x3fffff) <
        in_RDI->_M_elems[0x16].HeaderBytes) {
      original_00 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                              (in_RDI,in_stack_ffffffffffffff88);
      if ((original_00->Buffer).Bytes == 0) {
        in_RSI->Data = (uchar *)0x0;
        in_RSI->DataBytes = 0;
        local_48 = Siamese_NeedMoreData;
      }
      else {
        uVar1 = LoadOriginal(original_00,in_RSI);
        if (uVar1 == 0) {
          *(undefined1 *)&in_RDI[1]._M_elems[3].Buffer.Data = 1;
          local_48 = Siamese_Disabled;
        }
        else {
          local_48 = Siamese_Success;
        }
      }
    }
    else {
      in_RSI->Data = (uchar *)0x0;
      in_RSI->DataBytes = 0;
      local_48 = Siamese_NeedMoreData;
    }
  }
  else {
    local_48 = Siamese_Disabled;
  }
  return local_48;
}

Assistant:

SiameseResult Encoder::Get(SiameseOriginalPacket& originalOut)
{
    // Note: Keep this in sync with Decoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    SIAMESE_DEBUG_ASSERT(originalOut.PacketNum >= Window.ColumnStart);
    const unsigned element = Window.ColumnToElement(originalOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    SIAMESE_DEBUG_ASSERT(original->Column == originalOut.PacketNum);

    // Load original data and length
    if (0 == LoadOriginal(original, originalOut))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    return Siamese_Success;
}